

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O0

string_view absl::FindLongestCommonSuffix(string_view a,string_view b)

{
  char *__str;
  unsigned_long *puVar1;
  const_pointer pvVar2;
  size_type sVar3;
  const_pointer pvVar4;
  size_type sVar5;
  bool bVar6;
  size_type local_68;
  size_type count;
  char *pb;
  char *pa;
  size_type local_48;
  unsigned_long local_40;
  size_type limit;
  string_view b_local;
  string_view a_local;
  
  a_local._M_len = (size_t)a._M_str;
  b_local._M_str = (char *)a._M_len;
  b_local._M_len = (size_t)b._M_str;
  limit = b._M_len;
  local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&b_local._M_str);
  pa = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&limit);
  puVar1 = std::min<unsigned_long>(&local_48,(unsigned_long *)&pa);
  local_40 = *puVar1;
  if (local_40 == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&a_local._M_str);
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&b_local._M_str);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&b_local._M_str);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&limit);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&limit);
    count = (size_type)(pvVar4 + sVar5);
    local_68 = 0;
    __str = pvVar2 + sVar3;
    while( true ) {
      pb = __str + -1;
      count = count - 1;
      bVar6 = false;
      if (local_68 < local_40) {
        bVar6 = *pb == *(char *)count;
      }
      if (!bVar6) break;
      local_68 = local_68 + 1;
      __str = pb;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&a_local._M_str,__str,local_68);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

absl::string_view FindLongestCommonSuffix(absl::string_view a,
                                          absl::string_view b) {
  const absl::string_view::size_type limit = std::min(a.size(), b.size());
  if (limit == 0) return absl::string_view();

  const char* pa = a.data() + a.size() - 1;
  const char* pb = b.data() + b.size() - 1;
  absl::string_view::size_type count = (unsigned) 0;
  while (count < limit && *pa == *pb) {
    --pa;
    --pb;
    ++count;
  }

  return absl::string_view(++pa, count);
}